

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O3

void uv__getaddrinfo_done(uv__work *w,int status)

{
  uint uVar1;
  uv_loop_s *ptr;
  
  uVar1 = ((w[-2].loop)->active_reqs).count;
  if (uVar1 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/getaddrinfo.c"
                  ,0x70,"void uv__getaddrinfo_done(struct uv__work *, int)");
  }
  ((w[-2].loop)->active_reqs).count = uVar1 - 1;
  ptr = (uv_loop_s *)w[1].done;
  if (((ptr == (uv_loop_s *)0x0) && (ptr = (uv_loop_s *)w[1].wq.next, ptr == (uv_loop_s *)0x0)) &&
     (ptr = w[1].loop, ptr == (uv_loop_s *)0x0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/getaddrinfo.c"
                  ,0x7a,"void uv__getaddrinfo_done(struct uv__work *, int)");
  }
  uv__free(ptr);
  w[1].done = (_func_void_uv__work_ptr_int *)0x0;
  w[1].loop = (uv_loop_s *)0x0;
  w[1].wq.next = (uv__queue *)0x0;
  if (status == -0x7d) {
    if (*(int *)&w[2].work != 0) {
      __assert_fail("req->retcode == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/getaddrinfo.c"
                    ,0x81,"void uv__getaddrinfo_done(struct uv__work *, int)");
    }
    *(undefined4 *)&w[2].work = 0xfffff445;
  }
  if (w[1].work != (_func_void_uv__work_ptr *)0x0) {
    (*w[1].work)((uv__work *)&w[-2].done);
    return;
  }
  return;
}

Assistant:

static void uv__getaddrinfo_done(struct uv__work* w, int status) {
  uv_getaddrinfo_t* req;

  req = container_of(w, uv_getaddrinfo_t, work_req);
  uv__req_unregister(req->loop, req);

  /* See initialization in uv_getaddrinfo(). */
  if (req->hints)
    uv__free(req->hints);
  else if (req->service)
    uv__free(req->service);
  else if (req->hostname)
    uv__free(req->hostname);
  else
    assert(0);

  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;

  if (status == UV_ECANCELED) {
    assert(req->retcode == 0);
    req->retcode = UV_EAI_CANCELED;
  }

  if (req->cb)
    req->cb(req, req->retcode, req->addrinfo);
}